

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

int cmp_greediness(Parser *p,PNode *x,PNode *y)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  PNode *pPVar4;
  PNode *pPVar5;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  VecPNode pvx;
  VecPNode local_58;
  VecPNode local_30;
  
  local_58.n = 0;
  local_58.v = (PNode **)0x0;
  local_30.n = 0;
  local_30.v = (PNode **)0x0;
  get_unshared_pnodes(p,x,y,&local_58,&local_30);
  if (local_58.v != (PNode **)0x0) {
    qsort(local_58.v,(ulong)local_58.n,8,greedycmp);
  }
  if (local_30.v != (PNode **)0x0) {
    qsort(local_30.v,(ulong)local_30.n,8,greedycmp);
  }
  iVar9 = 0;
  if (local_30.n == 0 || local_58.n == 0) {
LAB_0014413a:
    if (local_58.v != local_58.e && local_58.v != (PNode **)0x0) {
      free(local_58.v);
    }
    local_58.n = 0;
    local_58.v = (PNode **)0x0;
    if (local_30.v != local_30.e && local_30.v != (PNode **)0x0) {
      free(local_30.v);
    }
    return iVar9;
  }
  uVar8 = 0;
  uVar10 = 0;
LAB_001440c6:
  pPVar4 = local_58.v[uVar10];
  pPVar5 = local_30.v[uVar8];
  if (pPVar4 == pPVar5) {
LAB_0014412a:
    uVar10 = uVar10 + 1;
  }
  else {
    pcVar6 = (pPVar5->parse_node).start_loc.s;
    pcVar7 = (pPVar4->parse_node).start_loc.s;
    if (pcVar7 < pcVar6) {
LAB_001440e9:
      uVar10 = uVar10 + 1;
      goto LAB_0014412f;
    }
    if (pcVar7 <= pcVar6) {
      iVar9 = (pPVar5->parse_node).symbol;
      iVar1 = (pPVar4->parse_node).symbol;
      if (iVar1 < iVar9) goto LAB_001440e9;
      if (iVar9 < iVar1) goto LAB_0014412d;
      pcVar6 = (pPVar5->parse_node).end;
      iVar9 = -1;
      pcVar7 = (pPVar4->parse_node).end;
      if (pcVar7 <= pcVar6) {
        if (pcVar7 < pcVar6) {
          iVar9 = 1;
        }
        else {
          uVar2 = (pPVar5->children).n;
          uVar3 = (pPVar4->children).n;
          if ((uVar2 <= uVar3) && (iVar9 = 1, uVar3 <= uVar2)) goto LAB_0014412a;
        }
      }
      goto LAB_0014413a;
    }
  }
LAB_0014412d:
  uVar8 = uVar8 + 1;
LAB_0014412f:
  iVar9 = 0;
  if ((local_58.n <= uVar10) || (local_30.n <= uVar8)) goto LAB_0014413a;
  goto LAB_001440c6;
}

Assistant:

static int cmp_greediness(Parser *p, PNode *x, PNode *y) {
  uint ix = 0, iy = 0;
  int ret = 0;

  VecPNode pvx, pvy;
  vec_clear(&pvx);
  vec_clear(&pvy);
  get_unshared_pnodes(p, x, y, &pvx, &pvy);
  if (pvx.v != NULL) qsort(pvx.v, pvx.n, sizeof(PNode *), greedycmp);
  if (pvy.v != NULL) qsort(pvy.v, pvy.n, sizeof(PNode *), greedycmp);
  while (1) {
    if (pvx.n <= ix || pvy.n <= iy) RET(0);
    x = pvx.v[ix];
    y = pvy.v[iy];
    if (x == y) {
      ix++;
      iy++;
    } else if (x->parse_node.start_loc.s < y->parse_node.start_loc.s)
      ix++;
    else if (x->parse_node.start_loc.s > y->parse_node.start_loc.s)
      iy++;
    else if (x->parse_node.symbol < y->parse_node.symbol)
      ix++;
    else if (x->parse_node.symbol > y->parse_node.symbol)
      iy++;
    else if (x->parse_node.end > y->parse_node.end)
      RET(-1);
    else if (x->parse_node.end < y->parse_node.end)
      RET(1);
    else if (x->children.n < y->children.n)
      RET(-1);
    else if (x->children.n > y->children.n)
      RET(1);
    else {
      ix++;
      iy++;
    }
  }
Lreturn:
  vec_free(&pvx);
  vec_free(&pvy);
  return ret;
}